

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  TTD_PTR_ID *pTVar2;
  TTD_PTR_ID TVar3;
  
  pTVar2 = (TTD_PTR_ID *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  TVar3 = FileReader::ReadAddr(reader,objectId,true);
  *pTVar2 = TVar3;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  *(byte *)(pTVar2 + 1) = (byte)iVar1;
  if (snpObject->SnapObjectTag == SnapGeneratorFunction) {
    snpObject->AddtlSnapObjectInfo = pTVar2;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapGeneratorFunctionInfo(SnapObject *snpObject, FileReader *reader, SlabAllocator &alloc)
        {
            SnapGeneratorFunctionInfo* sgfi = alloc.SlabAllocateStruct<SnapGeneratorFunctionInfo>();
            sgfi->scriptFunction = reader->ReadAddr(NSTokens::Key::objectId, true);
            sgfi->isAnonymousFunction = reader->ReadBool(NSTokens::Key::boolVal, true);
            SnapObjectSetAddtlInfoAs<SnapGeneratorFunctionInfo*, SnapObjectType::SnapGeneratorFunction>(snpObject, sgfi);
        }